

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O3

void PrintConstant(InstructionVMGraphContext *ctx,VmConstant *constant)

{
  VmValueType VVar1;
  VariableData *pVVar2;
  SynIdentifier *pSVar3;
  FunctionData *pFVar4;
  TypeBase *pTVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  char *format;
  ulong uVar9;
  double dVar10;
  
  VVar1 = (constant->super_VmValue).type.type;
  uVar6 = (constant->super_VmValue).type.size;
  if ((VVar1 == VM_TYPE_VOID) && (uVar6 == 0)) {
    pcVar8 = "{}";
LAB_001b14ff:
    Print(ctx,pcVar8);
    return;
  }
  if ((VVar1 == VM_TYPE_INT) && (uVar6 == 4)) {
    if (constant->isFloat != true) {
      uVar7 = (ulong)(uint)constant->iValue;
      pcVar8 = "%d";
LAB_001b1588:
      Print(ctx,pcVar8,uVar7);
      return;
    }
    dVar10 = (double)(float)constant->iValue;
    pcVar8 = "%ff";
  }
  else {
    if ((VVar1 != VM_TYPE_DOUBLE) || (uVar6 != 8)) {
      if ((VVar1 == VM_TYPE_LONG) && (uVar6 == 8)) {
        Print(ctx,"%lldl",constant->lValue);
        return;
      }
      if (VVar1 == VM_TYPE_FUNCTION) {
        pFVar4 = constant->fValue->function;
        if (pFVar4 == (FunctionData *)0x0) {
          pcVar8 = "global.f0000";
          goto LAB_001b14ff;
        }
        pcVar8 = (pFVar4->name->name).begin;
        uVar7 = (ulong)(uint)(*(int *)&(pFVar4->name->name).end - (int)pcVar8);
        uVar9 = (ulong)pFVar4->uniqueId;
        format = "%.*s.f%04x";
      }
      else {
        if (VVar1 != VM_TYPE_STRUCT) {
          if (VVar1 != VM_TYPE_POINTER) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                          ,0xd8,"void PrintConstant(InstructionVMGraphContext &, VmConstant *)");
          }
          pVVar2 = constant->container;
          if (pVVar2 == (VariableData *)0x0) {
            uVar6 = constant->iValue;
          }
          else {
            if (ctx->showContainers == true) {
              pcVar8 = (pVVar2->name->name).begin;
              uVar7 = (ulong)(uint)(*(int *)&(pVVar2->name->name).end - (int)pcVar8);
              uVar9 = (ulong)(uint)constant->iValue;
              format = "%.*s+0x%x";
              goto LAB_001b163b;
            }
            uVar6 = constant->iValue + pVVar2->offset;
          }
          uVar7 = (ulong)uVar6;
          pcVar8 = "0x%x";
          goto LAB_001b1588;
        }
        if (constant->isReference != true) {
          pTVar5 = (constant->super_VmValue).type.structType;
          Print(ctx,"{ %.*s }",
                (ulong)(uint)(*(int *)&(pTVar5->name).end - (int)(pTVar5->name).begin));
          return;
        }
        if (ctx->showContainers != true) {
          uVar7 = (ulong)(constant->iValue + constant->container->offset);
          pcVar8 = "*(0x%x)";
          goto LAB_001b1588;
        }
        pSVar3 = constant->container->name;
        pcVar8 = (pSVar3->name).begin;
        uVar7 = (ulong)(uint)(*(int *)&(pSVar3->name).end - (int)pcVar8);
        uVar9 = (ulong)(uint)constant->iValue;
        format = "*(%.*s+0x%x)";
      }
LAB_001b163b:
      Print(ctx,format,uVar7,pcVar8,uVar9);
      return;
    }
    dVar10 = constant->dValue;
    pcVar8 = "%f";
  }
  Print(ctx,pcVar8,dVar10);
  return;
}

Assistant:

bool operator==(const VmType& rhs) const
	{
		return type == rhs.type && size == rhs.size;
	}